

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bspwm.cpp
# Opt level: O2

void __thiscall rw::BSPWM::swap(BSPWM *this,Window *a,Window *b)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_dc;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [32];
  string local_80;
  string local_60 [32];
  string local_40;
  
  std::__cxx11::string::string((string *)&local_c0,"bspc",&local_d9);
  std::__cxx11::string::string(local_a0,"node",&local_da);
  std::__cxx11::to_string(&local_80,a->window_id);
  std::__cxx11::string::string(local_60,"--swap",&local_db);
  std::__cxx11::to_string(&local_40,b->window_id);
  __l._M_len = 5;
  __l._M_array = &local_c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d8,__l,&local_dc);
  subprocess::call(&local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void BSPWM::swap(const Window *a, const Window *b) {
        subprocess::call({"bspc", "node", to_string(a->window_id),
                          "--swap", to_string(b->window_id)});
    }